

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::currency
          (AffixTokenMatcherWarehouse *this,UErrorCode *status)

{
  AffixTokenMatcherSetupData *pAVar1;
  long lVar2;
  UnicodeString *this_00;
  UnicodeString *src;
  undefined1 local_308 [536];
  UnicodeString local_f0;
  UnicodeString local_b0;
  CharString local_70;
  
  pAVar1 = this->fSetupData;
  CombinedCurrencyMatcher::CombinedCurrencyMatcher
            ((CombinedCurrencyMatcher *)local_308,pAVar1->currencySymbols,pAVar1->dfs,
             pAVar1->parseFlags,status);
  *(undefined8 *)(this->fCurrency).fCurrencyCode = local_308._8_8_;
  UnicodeString::moveFrom(&(this->fCurrency).fCurrency1,(UnicodeString *)(local_308 + 0x10));
  UnicodeString::moveFrom(&(this->fCurrency).fCurrency2,(UnicodeString *)(local_308 + 0x50));
  (this->fCurrency).fUseFullCurrencyData = local_308[0x90];
  this_00 = (UnicodeString *)&(this->fCurrency).field_0x98;
  lVar2 = 6;
  src = (UnicodeString *)(local_308 + 0x98);
  do {
    UnicodeString::moveFrom(this_00,src);
    src = src + 1;
    this_00 = this_00 + 1;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  UnicodeString::moveFrom(&(this->fCurrency).afterPrefixInsert,&local_f0);
  UnicodeString::moveFrom(&(this->fCurrency).beforeSuffixInsert,&local_b0);
  CharString::operator=(&(this->fCurrency).fLocaleName,&local_70);
  local_308._0_8_ = &PTR__CombinedCurrencyMatcher_003dafe8;
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_70.buffer);
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_f0);
  lVar2 = 0x1d8;
  do {
    UnicodeString::~UnicodeString((UnicodeString *)(local_308 + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0x58);
  UnicodeString::~UnicodeString((UnicodeString *)(local_308 + 0x50));
  UnicodeString::~UnicodeString((UnicodeString *)(local_308 + 0x10));
  NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)local_308);
  return &(this->fCurrency).super_NumberParseMatcher;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::currency(UErrorCode& status) {
    return fCurrency = {fSetupData->currencySymbols, fSetupData->dfs, fSetupData->parseFlags, status};
}